

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Asp::LogicProgram::findBody
          (LogicProgram *this,uint32 hash,Body_t type,uint32 size,weight_t bound,WeightLit_t *sum)

{
  PrgBody *rhs;
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var2;
  bool bVar3;
  LogicProgram *this_00;
  IndexIter it;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar4;
  uint32 local_44;
  WeightLitSpan local_40;
  
  local_44 = hash;
  pVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                         *)this->index_,&local_44);
  _Var2._M_cur = (__node_type *)
                 pVar4.first.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                 _M_cur;
  if (type.val_ == Normal) {
    bound = size;
  }
  bVar3 = false;
  do {
    if ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var2._M_cur ==
        pVar4.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
        _M_cur.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>) {
      return 0x40000000;
    }
    rhs = (this->bodies_).ebo_.buf
          [*(uint *)((long)&((_Var2._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                            ._M_storage._M_storage + 4)];
    bVar1 = checkBody(this,rhs,type,size,bound);
    if ((bVar1) &&
       (bVar1 = (*(uint *)&rhs->field_0x8 & 0x18000000) != 0,
       this_00 = (LogicProgram *)&this->atomState_,
       bVar1 = AtomState::inBody(&this->atomState_,(Literal *)(&rhs[1].super_PrgNode + bVar1),
                                 (Literal *)
                                 (&(&rhs[1].super_PrgNode)[bVar1].field_0x0 +
                                 (ulong)(*(uint *)&rhs->field_0x8 & 0x1ffffff) * 4)), bVar1)) {
      if ((*(uint *)&rhs->field_0x8 & 0x18000000) != 0x8000000) {
LAB_0013d289:
        return *(uint *)&(rhs->super_PrgNode).field_0x4 & 0xfffffff;
      }
      if (sum != (WeightLit_t *)0x0) {
        if (!bVar3) {
          this_00 = (LogicProgram *)sum;
          std::__sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_less_iter>(sum,sum + size);
        }
        local_40.first = sum;
        local_40.size = (ulong)size;
        bVar1 = equalLits(this_00,rhs,&local_40);
        bVar3 = true;
        if (bVar1) goto LAB_0013d289;
      }
    }
    _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt;
  } while( true );
}

Assistant:

uint32 LogicProgram::findBody(uint32 hash, Body_t type, uint32 size, weight_t bound, Potassco::WeightLit_t* sum) {
	IndexRange bodies = index_->body.equal_range(hash);
	bool sorted = false;
	if (type == Body_t::Normal) { bound = static_cast<weight_t>(size); }
	for (IndexIter it = bodies.first; it != bodies.second; ++it) {
		const PrgBody& b = *getBody(it->second);
		if (!checkBody(b, type, size, bound) || !atomState_.inBody(b.goals_begin(), b.goals_end())) {
			continue;
		}
		else if (!b.hasWeights()) {
			return b.id();
		}
		else if (sum) {
			if (!sorted) {
				std::sort(sum, sum + size);
				sorted = true;
			}
			if (equalLits(b, Potassco::toSpan(sum, size))) { return b.id(); }
		}
	}
	return varMax;
}